

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcLightSourcePositional,_5UL>::
         Construct(DB *db,LIST *params)

{
  IfcLightSource *this;
  
  this = (IfcLightSource *)operator_new(0xd0);
  *(undefined ***)
   &this[1].super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 =
       &PTR__Object_008ee2a0;
  *(undefined8 *)&this[1].super_IfcGeometricRepresentationItem.field_0x28 = 0;
  *(char **)&this[1].super_IfcGeometricRepresentationItem.field_0x30 = "IfcLightSourcePositional";
  Assimp::IFC::Schema_2x3::IfcLightSource::IfcLightSource
            (this,&PTR_construction_vtable_24__00921010);
  *(undefined8 *)&this->field_0x88 = 0;
  *(undefined8 *)&this->field_0x90 = 0;
  (this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x920f58;
  *(undefined8 *)
   &this[1].super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x920ff8;
  *(undefined8 *)
   &(this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x920f80;
  *(undefined8 *)
   &(this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x920fa8;
  *(undefined8 *)&this->field_0x80 = 0x920fd0;
  return (Object *)
         &this[1].super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
          super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20;
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }